

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

void amrex::VisMF::AsyncWriteDoit
               (FabArray<amrex::FArrayBox> *mf,string *mf_name,bool is_rvalue,bool valid_cells_only)

{
  undefined4 uVar1;
  element_type *peVar2;
  pointer pBVar3;
  long lVar4;
  BaseFab<double> *this;
  ulong uVar5;
  element_type *peVar6;
  pointer plVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  element_type *peVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  int iVar11;
  int iVar12;
  RealDescriptor *pRVar13;
  Arena *pAVar14;
  FABio *pFVar15;
  long lVar16;
  Long LVar17;
  int *piVar18;
  FABio_binary *this_00;
  undefined4 extraout_var;
  __uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true> _Var19;
  bool bVar20;
  undefined7 in_register_00000009;
  void *__child_stack;
  BaseFab<double> *this_01;
  FabArray<amrex::FArrayBox> *src;
  shared_ptr<amrex::Vector<long,_std::allocator<long>_>_> *__arg;
  int comp;
  ulong uVar22;
  double dVar23;
  double *pdVar24;
  uint uVar25;
  shared_ptr<amrex::Vector<long,_std::allocator<long>_>_> sVar26;
  pair<double,_double> pVar27;
  int local_2f4;
  ulong local_2f0;
  ulong local_2e8;
  shared_ptr<amrex::FABio> fabio;
  shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>_> myfabs;
  shared_ptr<amrex::VisMF::Header> hdr;
  Vector<long,_std::allocator<long>_> localdata;
  MFIter mfi;
  shared_ptr<amrex::Vector<long,_std::allocator<long>_>_> globaldata;
  stringstream hss;
  __shared_ptr<amrex::VisMF::Header,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  int local_1a0;
  undefined4 uStack_19c;
  int local_198 [2];
  __shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<amrex::Vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2> local_180;
  string local_170 [32];
  __shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2>
  local_150;
  __shared_ptr<amrex::FABio,_(__gnu_cxx::_Lock_policy)2> local_140 [17];
  pointer ppFVar21;
  
  uVar1 = *(undefined4 *)(ParallelContext::frames + 0xc);
  uVar25 = *(uint *)(ParallelContext::frames + 0x10);
  pRVar13 = FPC::NativeRealDescriptor();
  _hss = 1;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
  __arg = &globaldata;
  globaldata.
  super___shared_ptr<amrex::Vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
  _0_1_ = 0;
  std::
  make_shared<amrex::VisMF::Header,amrex::FabArray<amrex::FArrayBox>const&,amrex::VisMF::How,amrex::VisMF::Header::Version,bool>
            ((FabArray<amrex::FArrayBox> *)&hdr,(How *)mf,(Version *)&hss,(bool *)&mfi);
  if ((int)CONCAT71(in_register_00000009,valid_cells_only) != 0) {
    ((hdr.super___shared_ptr<amrex::VisMF::Header,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_ngrow).
    vect[0] = 0;
    ((hdr.super___shared_ptr<amrex::VisMF::Header,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_ngrow).
    vect[1] = 0;
    ((hdr.super___shared_ptr<amrex::VisMF::Header,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_ngrow).
    vect[2] = 0;
  }
  peVar2 = (mf->super_FabArrayBase).boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pBVar3 = (peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data;
  iVar12 = (mf->super_FabArrayBase).n_comp;
  uVar22 = (ulong)iVar12;
  std::vector<long,_std::allocator<long>_>::vector
            (&localdata.super_vector<long,_std::allocator<long>_>,
             (long)(int)((ulong)((long)(mf->super_FabArrayBase).indexArray.
                                       super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(mf->super_FabArrayBase).indexArray.
                                      super_vector<int,_std::allocator<int>_>.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2) * (uVar22 * 2 + 1) + 1
             ,(allocator_type *)&hss);
  pAVar14 = DataAllocator::arena(&mf->m_dallocator);
  ppFVar21 = (pointer)pAVar14->_vptr_Arena;
  iVar11 = (*(code *)ppFVar21[7])(pAVar14);
  if ((char)iVar11 == '\0') {
    pAVar14 = DataAllocator::arena(&mf->m_dallocator);
    ppFVar21 = (pointer)pAVar14->_vptr_Arena;
    (*(code *)ppFVar21[8])(pAVar14);
  }
  plVar7 = localdata.super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (valid_cells_only) {
    bVar20 = (mf->super_FabArrayBase).n_grow.vect[2] != 0 ||
             *(long *)(mf->super_FabArrayBase).n_grow.vect != 0;
    ppFVar21 = (pointer)CONCAT71((int7)((ulong)ppFVar21 >> 8),bVar20);
  }
  else {
    bVar20 = false;
  }
  local_2f0 = (ulong)uVar25;
  local_2e8 = uVar22;
  if ((long)localdata.super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)localdata.super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
      < 9) {
    dVar23 = 0.0;
  }
  else {
    pFVar15 = FArrayBox::getFABio();
    dVar23 = 0.0;
    MFIter::MFIter(&mfi,&mf->super_FabArrayBase,'\0');
    pdVar24 = (double *)(plVar7 + 1);
    iVar11 = 0;
    if (0 < iVar12) {
      iVar11 = iVar12;
    }
    while (mfi.currentIndex < mfi.endIndex) {
      *pdVar24 = dVar23;
      piVar18 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar18 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      this = &(mf->m_fabs_v).
              super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar18]->super_BaseFab<double>;
      MFIter::validbox((Box *)&myfabs,&mfi);
      std::__cxx11::stringstream::stringstream((stringstream *)&hss);
      uVar22 = local_2e8;
      __arg = (shared_ptr<amrex::Vector<long,_std::allocator<long>_>_> *)0x0;
      FArrayBox::FArrayBox
                ((FArrayBox *)&globaldata,(Box *)&myfabs,(int)local_2e8,false,false,(Arena *)0x0);
      this_01 = this;
      if (bVar20) {
        this_01 = (BaseFab<double> *)&globaldata;
      }
      ppFVar21 = (pointer)(uVar22 & 0xffffffff);
      (*pFVar15->_vptr_FABio[6])(pFVar15,&local_1b0._M_refcount,this_01);
      lVar16 = std::ostream::tellp();
      LVar17 = BaseFab<double>::size(this_01);
      iVar12 = RealDescriptor::numBytes(pRVar13);
      pdVar24 = pdVar24 + 1;
      for (comp = 0; iVar11 != comp; comp = comp + 1) {
        pVar27 = BaseFab<double>::minmax<(amrex::RunOn)1>(this,(Box *)&myfabs,comp);
        *pdVar24 = pVar27.first;
        pdVar24[1] = pVar27.second;
        pdVar24 = pdVar24 + 2;
      }
      dVar23 = (double)(lVar16 + (long)dVar23 + LVar17 * iVar12);
      BaseFab<double>::~BaseFab((BaseFab<double> *)&globaldata);
      std::__cxx11::stringstream::~stringstream((stringstream *)&hss);
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
    uVar25 = (uint)local_2f0;
  }
  *localdata.super_vector<long,_std::allocator<long>_>.
   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (long)dVar23;
  sVar26 = std::make_shared<amrex::Vector<long,std::allocator<long>>>();
  if (uVar25 == 1) {
    std::vector<long,_std::allocator<long>_>::_M_move_assign
              ((vector<long,_std::allocator<long>_> *)
               CONCAT71(globaldata.
                        super___shared_ptr<amrex::Vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._1_7_,
                        globaldata.
                        super___shared_ptr<amrex::Vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._0_1_),&localdata,
               sVar26.
               super___shared_ptr<amrex::Vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi._M_pi);
  }
  std::make_shared<amrex::Vector<amrex::FArrayBox,std::allocator<amrex::FArrayBox>>>();
  src = mf;
  MFIter::MFIter((MFIter *)&hss,&mf->super_FabArrayBase,'\0');
  do {
    iVar12 = (int)ppFVar21;
    if ((int)local_190._M_ptr <= local_198[0]) {
      MFIter::~MFIter((MFIter *)&hss);
      this_00 = (FABio_binary *)operator_new(0x10);
      uVar5 = local_2e8;
      uVar22 = local_2f0;
      pRVar13 = FPC::NativeRealDescriptor();
      iVar12 = RealDescriptor::clone(pRVar13,(__fn *)src,__child_stack,iVar12,__arg);
      FABio_binary::FABio_binary(this_00,(RealDescriptor *)CONCAT44(extraout_var,iVar12));
      std::__shared_ptr<amrex::FABio,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<amrex::FABio_binary,void>
                ((__shared_ptr<amrex::FABio,(__gnu_cxx::_Lock_policy)2> *)&fabio,this_00);
      _hss = uVar1;
      std::__shared_ptr<amrex::VisMF::Header,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1b0,
                 &hdr.super___shared_ptr<amrex::VisMF::Header,_(__gnu_cxx::_Lock_policy)2>);
      local_1a0 = (int)(((long)pBVar3 - lVar4) / 0x1c);
      uStack_19c = (undefined4)uVar5;
      local_198[0] = (int)uVar22;
      std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_190,
                 (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
                 &(mf->super_FabArrayBase).distributionMap);
      std::__shared_ptr<amrex::Vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_180,
                   &globaldata.
                    super___shared_ptr<amrex::Vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
      std::__cxx11::string::string(local_170,(string *)mf_name);
      std::
      __shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_150,
                     &myfabs.
                      super___shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      std::__shared_ptr<amrex::FABio,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (local_140,&fabio.super___shared_ptr<amrex::FABio,_(__gnu_cxx::_Lock_policy)2>);
      mfi.tile_size.vect[0] = 0;
      mfi.tile_size.vect[1] = 0;
      mfi.tile_size.vect[2] = 0;
      mfi.flags = '\0';
      mfi._29_3_ = 0;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
      mfi.fabArray = (FabArrayBase *)0x0;
      _Var19.super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
      _M_t.super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
           operator_new(0x88);
      _Var8._M_pi = local_1b0._M_refcount._M_pi;
      *(ulong *)_Var19.
                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           CONCAT44(uVar25 - 1,_hss);
      local_1b0._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(element_type **)
       ((long)_Var19.
              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
              _M_t.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 8) =
           local_1b0._M_ptr;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)_Var19.
              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
              _M_t.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x10) =
           _Var8._M_pi;
      local_1b0._M_ptr = (element_type *)0x0;
      *(int *)((long)_Var19.
                     super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x20) =
           local_198[0];
      *(ulong *)((long)_Var19.
                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x18) =
           CONCAT44(uStack_19c,local_1a0);
      std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)_Var19.
                        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x28),
                 &local_190);
      _Var8._M_pi = local_180._M_refcount._M_pi;
      local_180._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(element_type **)
       ((long)_Var19.
              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
              _M_t.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x38) =
           local_180._M_ptr;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)_Var19.
              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
              _M_t.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x40) =
           _Var8._M_pi;
      local_180._M_ptr = (element_type *)0x0;
      std::__cxx11::string::string
                ((string *)
                 ((long)_Var19.
                        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x48),
                 local_170);
      _Var10._M_pi = local_140[0]._M_refcount._M_pi;
      peVar9 = local_140[0]._M_ptr;
      _Var8._M_pi = local_150._M_refcount._M_pi;
      peVar6 = local_150._M_ptr;
      local_150._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_150._M_ptr = (element_type *)0x0;
      local_140[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_140[0]._M_ptr = (element_type *)0x0;
      *(element_type **)
       ((long)_Var19.
              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
              _M_t.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x68) = peVar6;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)_Var19.
              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
              _M_t.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x70) =
           _Var8._M_pi;
      *(element_type **)
       ((long)_Var19.
              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
              _M_t.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x78) = peVar9;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)_Var19.
              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
              _M_t.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 0x80) =
           _Var10._M_pi;
      mfi._24_8_ = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_VisMF.cpp:2362:22)>
                   ::_M_invoke;
      mfi.tile_size.vect._0_8_ =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_VisMF.cpp:2362:22)>
           ::_M_manager;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )_Var19.
               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
      AsyncOut::Submit((function<void_()> *)&mfi);
      std::_Function_base::~_Function_base((_Function_base *)&mfi);
      AsyncWriteDoit(amrex::FabArray<amrex::FArrayBox>const&,std::__cxx11::string_const&,bool,bool)
      ::$_0::~__0((__0 *)&hss);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&fabio.super___shared_ptr<amrex::FABio,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&myfabs.
                  super___shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&globaldata.
                  super___shared_ptr<amrex::Vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&localdata);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&hdr.super___shared_ptr<amrex::VisMF::Header,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    if (bVar20) {
      MFIter::validbox((Box *)&mfi,(MFIter *)&hss);
LAB_0040cba5:
      peVar6 = myfabs.
               super___shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_2f4 = (mf->super_FabArrayBase).n_comp;
      fabio.super___shared_ptr<amrex::FABio,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)The_Cpu_Arena();
      std::vector<amrex::FArrayBox,std::allocator<amrex::FArrayBox>>::
      emplace_back<amrex::Box&,int,amrex::Arena*>
                ((vector<amrex::FArrayBox,std::allocator<amrex::FArrayBox>> *)peVar6,(Box *)&mfi,
                 &local_2f4,(Arena **)&fabio);
      piVar18 = local_198;
      if ((pointer)local_180._M_refcount._M_pi != (pointer)0x0) {
        piVar18 = (int *)(((_Alloc_hider *)&(local_180._M_refcount._M_pi)->_vptr__Sp_counted_base)->
                          _M_p + (long)local_198[0] * 4);
      }
      ppFVar21 = (mf->m_fabs_v).
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      src = (FabArray<amrex::FArrayBox> *)ppFVar21[*piVar18];
      BaseFab<double>::copy<(amrex::RunOn)1>
                (&((myfabs.
                    super___shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>).
                  super__Vector_base<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].super_BaseFab<double>,(BaseFab<double> *)src
                 ,(Box *)&mfi);
    }
    else {
      MFIter::fabbox((Box *)&mfi,(MFIter *)&hss);
      if (!is_rvalue) goto LAB_0040cba5;
      piVar18 = local_198;
      if ((pointer)local_180._M_refcount._M_pi != (pointer)0x0) {
        piVar18 = (int *)(((_Alloc_hider *)&(local_180._M_refcount._M_pi)->_vptr__Sp_counted_base)->
                          _M_p + (long)local_198[0] * 4);
      }
      ppFVar21 = (mf->m_fabs_v).
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      src = (FabArray<amrex::FArrayBox> *)ppFVar21[*piVar18];
      std::vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>::
      emplace_back<amrex::FArrayBox>
                (&(myfabs.
                   super___shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,
                 (FArrayBox *)src);
    }
    MFIter::operator++((MFIter *)&hss);
  } while( true );
}

Assistant:

void
VisMF::AsyncWriteDoit (const FabArray<FArrayBox>& mf, const std::string& mf_name,
                       bool is_rvalue, bool valid_cells_only)
{
    BL_PROFILE("VisMF::AsyncWrite()");

    AMREX_ASSERT(mf_name[mf_name.length() - 1] != '/');
    static_assert(sizeof(int64_t) == sizeof(Real)*2 || sizeof(int64_t) == sizeof(Real),
                  "AsyncWrite: unsupported Real size");

    const DistributionMapping& dm = mf.DistributionMap();

    const int myproc = ParallelDescriptor::MyProc();
    const int nprocs = ParallelDescriptor::NProcs();
    const int io_proc = nprocs - 1;

    RealDescriptor const& whichRD = FPC::NativeRealDescriptor();

    auto hdr = std::make_shared<VisMF::Header>(mf, VisMF::NFiles, VisMF::Header::Version_v1, false);
    if (valid_cells_only) hdr->m_ngrow = IntVect(0);

    constexpr int sizeof_int64_over_real = sizeof(int64_t) / sizeof(Real);
    const int n_local_fabs = mf.local_size();
    const int n_global_fabs = mf.size();
    const int ncomp = mf.nComp();
    const Long n_fab_reals = 2*ncomp;
    const Long n_fab_int64 = 1;
    const Long n_fab_nums = (n_fab_reals/sizeof_int64_over_real) + n_fab_int64;
    const Long n_local_nums = n_fab_nums * n_local_fabs + 1;
    Vector<int64_t> localdata(n_local_nums);

    bool data_on_device = mf.arena()->isManaged() || mf.arena()->isDevice();
    bool run_on_device = data_on_device && Gpu::inLaunchRegion();

    bool strip_ghost = valid_cells_only && mf.nGrowVect() != 0;

    int64_t total_bytes = 0;
    if (localdata.size() > 1) {
        char* pld = (char*)(&(localdata[1]));
        const FABio& fio = FArrayBox::getFABio();
        for (MFIter mfi(mf); mfi.isValid(); ++mfi)
        {
            std::memcpy(pld, &total_bytes, sizeof(int64_t));
            pld += sizeof(int64_t);

            const FArrayBox& fab = mf[mfi];
            const Box& bx = mfi.validbox();

            std::stringstream hss;
            FArrayBox valid_fab(bx, ncomp, false);
            FArrayBox const& header_fab = (strip_ghost) ? valid_fab : fab;
            fio.write_header(hss, header_fab, ncomp);
            total_bytes += static_cast<std::streamoff>(hss.tellp());
            total_bytes += header_fab.size() * whichRD.numBytes();

            // compute min and max
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                auto mm = (run_on_device) ? fab.minmax<RunOn::Device>(bx,icomp)
                                          : fab.minmax<RunOn::Host  >(bx,icomp);
                std::memcpy(pld, &(mm.first), sizeof(Real));
                pld += sizeof(Real);
                std::memcpy(pld, &(mm.second), sizeof(Real));
                pld += sizeof(Real);
            }
        }
    }
    localdata[0] = total_bytes;

    auto globaldata = std::make_shared<Vector<int64_t> >();
    if (nprocs == 1) {
        *globaldata = std::move(localdata);
    }
#ifdef BL_USE_MPI
    else {
        const Long n_global_nums = n_fab_nums * n_global_fabs + nprocs;
        Vector<int> rcnt, rdsp;
        if (myproc == io_proc) {
            globaldata->resize(n_global_nums);
            rcnt.resize(nprocs,1);
            rdsp.resize(nprocs,0);
            for (int k = 0; k < n_global_fabs; ++k) {
                int rank = dm[k];
                rcnt[rank] += n_fab_nums;
            }
            std::partial_sum(rcnt.begin(), rcnt.end()-1, rdsp.begin()+1);
        } else {
            globaldata->resize(1,0);
            rcnt.resize(1,0);
            rdsp.resize(1,0);
        }
        BL_MPI_REQUIRE(MPI_Gatherv(localdata.data(), localdata.size(), MPI_INT64_T,
                                   globaldata->data(), rcnt.data(), rdsp.data(), MPI_INT64_T,
                                   io_proc, ParallelDescriptor::Communicator()));
    }
#endif

    auto myfabs = std::make_shared<Vector<FArrayBox> >();
    for (MFIter mfi(mf); mfi.isValid(); ++mfi) {
        Box bx = strip_ghost ? mfi.validbox() : mfi.fabbox();
#ifdef AMREX_USE_GPU
        if (data_on_device) {
            myfabs->emplace_back(bx, mf.nComp(), The_Pinned_Arena());
            auto& new_fab = myfabs->back();
            if (strip_ghost) {
                new_fab.copy<RunOn::Device>(mf[mfi], bx);
            } else {
                Gpu::dtoh_memcpy_async(new_fab.dataPtr(), mf[mfi].dataPtr(), new_fab.size()*sizeof(Real));
            }
        } else
#endif
        {
            if (is_rvalue && ! strip_ghost) {
                myfabs->emplace_back(std::move(const_cast<FArrayBox&>(mf[mfi])));
            } else {
                myfabs->emplace_back(bx, mf.nComp(), The_Cpu_Arena());
                auto& new_fab = myfabs->back();
                new_fab.copy<RunOn::Host>(mf[mfi], bx);
            }
        }
    }

    std::shared_ptr<FABio> fabio(new FABio_binary(FPC::NativeRealDescriptor().clone()));

    AsyncOut::Submit([=] ()
    {
        if (myproc == io_proc)
        {
            hdr->m_fod.resize(n_global_fabs);
            hdr->m_min.resize(n_global_fabs);
            hdr->m_max.resize(n_global_fabs);
            hdr->m_famin.clear();
            hdr->m_famax.clear();
            hdr->m_famin.resize(ncomp,std::numeric_limits<Real>::max());
            hdr->m_famax.resize(ncomp,std::numeric_limits<Real>::lowest());

            Vector<int64_t> nbytes_on_rank(nprocs,-1L);
            Vector<Vector<int> > gidx(nprocs);
            for (int k = 0; k < n_global_fabs; ++k) {
                int rank = dm[k];
                gidx[rank].push_back(k);
            }

            auto pgd = (char*)(globaldata->data());
            {
                int rank = 0, lidx = 0;
                for (int j = 0; j < n_global_fabs; ++j)
                {
                    int k = -1;
                    do {
                        if (lidx < gidx[rank].size()) {
                            k = gidx[rank][lidx];
                            ++lidx;
                        } else {
                            ++rank;
                            lidx = 0;
                        }
                    } while (k < 0);

                    hdr->m_min[k].resize(ncomp);
                    hdr->m_max[k].resize(ncomp);

                    if (nbytes_on_rank[rank] < 0) { // First time for this rank
                        std::memcpy(&(nbytes_on_rank[rank]), pgd, sizeof(int64_t));
                        pgd += sizeof(int64_t);
                    }

                    int64_t nbytes;
                    std::memcpy(&nbytes, pgd, sizeof(int64_t));
                    pgd += sizeof(int64_t);

                    for (int icomp = 0; icomp < ncomp; ++icomp) {
                        Real cmin, cmax;
                        std::memcpy(&cmin, pgd             , sizeof(Real));
                        std::memcpy(&cmax, pgd+sizeof(Real), sizeof(Real));
                        pgd += sizeof(Real)*2;
                        hdr->m_min[k][icomp] = cmin;
                        hdr->m_max[k][icomp] = cmax;
                        hdr->m_famin[icomp] = std::min(hdr->m_famin[icomp],cmin);
                        hdr->m_famax[icomp] = std::max(hdr->m_famax[icomp],cmax);
                    }

                    auto info = AsyncOut::GetWriteInfo(rank);
                    hdr->m_fod[k].m_name = amrex::Concatenate(VisMF::BaseName(mf_name)+FabFileSuffix,
                                                              info.ifile, 5);
                    hdr->m_fod[k].m_head = nbytes;
                }
            }

            Vector<int64_t> offset(nprocs);
            for (int ip = 0; ip < nprocs; ++ip) {
                auto info = AsyncOut::GetWriteInfo(ip);
                if (info.ispot == 0) {
                    offset[ip] = 0;
                } else {
                    offset[ip] = offset[ip-1] + nbytes_on_rank[ip-1];
                }
            }

            for (int k = 0; k < n_global_fabs; ++k) {
                hdr->m_fod[k].m_head += offset[dm[k]];
            }

            VisMF::WriteHeaderDoit(mf_name, *hdr);
        }

        VisMF::IO_Buffer io_buffer(ioBufferSize);

        AsyncOut::Wait();  // Wait for my turn

        auto info = AsyncOut::GetWriteInfo(myproc);
        if (! myfabs->empty()) {
            std::string file_name = amrex::Concatenate(mf_name + FabFileSuffix, info.ifile, 5);
            std::ofstream ofs;
            ofs.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
            ofs.open(file_name.c_str(), (info.ispot == 0) ? (std::ios::binary | std::ios::trunc)
                                                          : (std::ios::binary | std::ios::app));
            if (!ofs.good()) amrex::FileOpenFailed(file_name);
            for (auto const& fab : *myfabs) {
                fabio->write_header(ofs, fab, fab.nComp());
                fabio->write(ofs, fab, 0, fab.nComp());
            }
            ofs.flush();
            ofs.close();
        }

        AsyncOut::Notify();  // Notify others I am done
    });
}